

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

bool __thiscall QNetworkProxy::operator==(QNetworkProxy *this,QNetworkProxy *other)

{
  QNetworkProxyPrivate *pQVar1;
  QNetworkProxyPrivate *pQVar2;
  bool bVar3;
  
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    return true;
  }
  if (pQVar1 == (QNetworkProxyPrivate *)0x0 || pQVar2 == (QNetworkProxyPrivate *)0x0) {
    return false;
  }
  if (pQVar2->type != pQVar1->type) {
    return false;
  }
  if ((((pQVar2->port == pQVar1->port) &&
       (bVar3 = comparesEqual(&pQVar2->hostName,&pQVar1->hostName), bVar3)) &&
      (bVar3 = comparesEqual(&pQVar2->user,&pQVar1->user), bVar3)) &&
     (bVar3 = comparesEqual(&pQVar2->password,&pQVar1->password), bVar3)) {
    return (pQVar2->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
           super_QFlagsStorage<QNetworkProxy::Capability>.i ==
           (pQVar1->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
           super_QFlagsStorage<QNetworkProxy::Capability>.i;
  }
  return false;
}

Assistant:

constexpr P get() const noexcept { return ptr; }